

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

Unit * Lib::List<Kernel::Unit_*>::pop(List<Kernel::Unit_*> **lst)

{
  List<Kernel::Unit_*> *pLVar1;
  Unit *pUVar2;
  undefined8 *in_RDI;
  Unit *result;
  List<Kernel::Unit_*> *tail;
  size_t in_stack_ffffffffffffffd8;
  
  pLVar1 = List<Kernel::Unit_*>::tail((List<Kernel::Unit_*> *)*in_RDI);
  pUVar2 = head((List<Kernel::Unit_*> *)*in_RDI);
  if ((void *)*in_RDI != (void *)0x0) {
    List<Kernel::Unit*>::operator_delete((void *)*in_RDI,in_stack_ffffffffffffffd8);
  }
  *in_RDI = pLVar1;
  return pUVar2;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }